

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<float>::Fad<FadFuncSqrt<Fad<float>>>
          (Fad<float> *this,FadExpr<FadFuncSqrt<Fad<float>_>_> *fadexpr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  value_type vVar5;
  
  fVar4 = (fadexpr->fadexpr_).expr_.val_;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  this->val_ = fVar4;
  Vector<float>::Vector(&this->dx_,(fadexpr->fadexpr_).expr_.dx_.num_elts);
  this->defaultVal = 0.0;
  uVar1 = (fadexpr->fadexpr_).expr_.dx_.num_elts;
  if (uVar1 != 0) {
    uVar2 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      vVar5 = FadFuncSqrt<Fad<float>_>::dx(&fadexpr->fadexpr_,(int)uVar2);
      (this->dx_).ptr_to_data[uVar2] = vVar5;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }